

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault
          (FieldGeneratorMap *this)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = *(int *)(this->descriptor_ + 0x2c);
  bVar4 = 0 < iVar1;
  if ((0 < iVar1) &&
     (bVar2 = HasNonZeroDefaultValue(*(FieldDescriptor **)(this->descriptor_ + 0x30)), !bVar2)) {
    lVar6 = 0;
    lVar5 = 0xa8;
    do {
      lVar6 = lVar6 + 1;
      lVar3 = (long)*(int *)(this->descriptor_ + 0x2c);
      bVar4 = lVar6 < lVar3;
      if (lVar3 <= lVar6) {
        return bVar4;
      }
      bVar2 = HasNonZeroDefaultValue
                        ((FieldDescriptor *)(lVar5 + *(long *)(this->descriptor_ + 0x30)));
      lVar5 = lVar5 + 0xa8;
    } while (!bVar2);
  }
  return bVar4;
}

Assistant:

bool FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(void) const {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (HasNonZeroDefaultValue(descriptor_->field(i))) {
      return true;
    }
  }

  return false;
}